

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.h
# Opt level: O0

ON_AerialPhotoImageFrustum * __thiscall
ON_AerialPhotoImageFrustum::operator=
          (ON_AerialPhotoImageFrustum *this,ON_AerialPhotoImageFrustum *param_1)

{
  ON_AerialPhotoImageFrustum *param_1_local;
  ON_AerialPhotoImageFrustum *this_local;
  
  ON_UnitSystem::operator=(&this->m_unit_system,&param_1->m_unit_system);
  memcpy(&this->m_height,&param_1->m_height,0x48);
  return this;
}

Assistant:

class ON_CLASS ON_AerialPhotoImageFrustum
{
public:
  ON_AerialPhotoImageFrustum();

  bool IsSet() const;

  bool HeightIsSet() const;
  bool CornersAreSet() const;
  bool UnitSystemIsSet() const;

  void Unset();

  // The frustum unit system must be set. It is common
  // for the frustum unit system to be millimeters.
  ON_UnitSystem m_unit_system;

  // The frustum's apex height must be positive.
  // It is common for the image frustum height
  // to be a camera's focal length.
  double m_height;

  // The corners must be the vertices of a 3 or 4 sided
  // convex region and must have counter-clockwise order
  // in the 2d plane.  It is common for the corners to be
  // a rectangle (lower left, lower right, upper right, 
  // upper left) and for the rectangle to be symmetric
  // about (0,0).  However, when the image has been cropped,
  // the frustum can be skew.  The frustum's apex point is 
  // always directly above (0,0).
  ON_2dPoint m_corners[4];
}